

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

void __thiscall
FIX::ExeceptionStore::get
          (ExeceptionStore *this,SEQNUM param_1,SEQNUM param_2,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_3)

{
  IOException *this_00;
  allocator<char> local_49;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_3_local;
  SEQNUM param_2_local;
  SEQNUM param_1_local;
  ExeceptionStore *this_local;
  
  local_28 = param_3;
  param_3_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)param_2;
  param_2_local = param_1;
  param_1_local = (SEQNUM)this;
  this_00 = (IOException *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"get threw an IOException",&local_49);
  IOException::IOException(this_00,&local_48);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

EXCEPT(IOException) {
    throw IOException("get threw an IOException");
  }